

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_variance_avx2.c
# Opt level: O3

uint aom_highbd_10_mse16x16_avx2
               (uint8_t *src8,int src_stride,uint8_t *ref8,int ref_stride,uint *sse)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  uint uVar5;
  undefined1 (*pauVar6) [32];
  int iVar7;
  undefined1 (*pauVar8) [32];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [32];
  
  pauVar8 = (undefined1 (*) [32])((long)src8 * 2);
  pauVar6 = (undefined1 (*) [32])((long)ref8 * 2);
  auVar9 = ZEXT1664((undefined1  [16])0x0);
  auVar10 = ZEXT1664((undefined1  [16])0x0);
  iVar7 = 0x10;
  do {
    auVar11 = vpsubw_avx2(*pauVar8,*pauVar6);
    auVar4 = vpmaddwd_avx2(auVar11,auVar11);
    auVar3 = vpaddd_avx2(auVar4,auVar9._0_32_);
    auVar9 = ZEXT3264(auVar3);
    auVar4 = vpaddw_avx2(auVar11,auVar10._0_32_);
    auVar10 = ZEXT3264(auVar4);
    pauVar8 = (undefined1 (*) [32])(*pauVar8 + (long)src_stride * 2);
    pauVar6 = (undefined1 (*) [32])(*pauVar6 + (long)ref_stride * 2);
    iVar7 = iVar7 + -1;
  } while (iVar7 != 0);
  auVar11._8_2_ = 1;
  auVar11._0_8_ = 0x1000100010001;
  auVar11._10_2_ = 1;
  auVar11._12_2_ = 1;
  auVar11._14_2_ = 1;
  auVar11._16_2_ = 1;
  auVar11._18_2_ = 1;
  auVar11._20_2_ = 1;
  auVar11._22_2_ = 1;
  auVar11._24_2_ = 1;
  auVar11._26_2_ = 1;
  auVar11._28_2_ = 1;
  auVar11._30_2_ = 1;
  auVar4 = vpmaddwd_avx2(auVar4,auVar11);
  auVar11 = vpunpckldq_avx2(auVar4,auVar3);
  auVar4 = vpunpckhdq_avx2(auVar4,auVar3);
  auVar4 = vpaddd_avx2(auVar11,auVar4);
  auVar1 = vpaddd_avx(auVar4._0_16_,auVar4._16_16_);
  auVar2 = vpshufd_avx(auVar1,0xee);
  auVar1 = vpaddd_avx(auVar1,auVar2);
  uVar5 = (uint)((ulong)auVar1._4_4_ + 8 >> 4);
  *sse = uVar5;
  return uVar5;
}

Assistant:

unsigned int aom_highbd_10_mse16x16_avx2(const uint8_t *src8, int src_stride,
                                         const uint8_t *ref8, int ref_stride,
                                         unsigned int *sse) {
  int sum;
  uint16_t *src = CONVERT_TO_SHORTPTR(src8);
  uint16_t *ref = CONVERT_TO_SHORTPTR(ref8);
  highbd_10_variance_avx2(src, src_stride, ref, ref_stride, 16, 16, sse, &sum,
                          highbd_calc16x16var_avx2, 16);
  return *sse;
}